

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O1

void Am_Finish_Dialog_Method_proc(Am_Object *widget,Am_Value *initial_value)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object window;
  Am_Object local_30;
  Am_Object local_28;
  Am_Value local_20;
  
  bVar1 = Am_Value::Valid(initial_value);
  if (bVar1) {
    Am_Object::Set(widget,0x169,initial_value,0);
  }
  bVar1 = Am_Object::Valid(widget);
  if (bVar1) {
    in_value = Am_Object::Get(widget,0x68,0);
    Am_Object::Am_Object(&local_28,in_value);
    bVar1 = Am_Object::Valid(&local_28);
    if (bVar1) {
      Am_Object::Am_Object(&local_30,&local_28);
      local_20.type = 4;
      local_20.value.bool_value = false;
      Am_Finish_Pop_Up_Waiting(&local_30,&local_20);
      Am_Value::~Am_Value(&local_20);
      Am_Object::~Am_Object(&local_30);
    }
    Am_Object::~Am_Object(&local_28);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Explicit_Widget_Run_Method, void, Am_Finish_Dialog_Method,
                 (Am_Object widget, Am_Value initial_value))
{
  if (initial_value.Valid())
    widget.Set(Am_VALUE, initial_value);
  if (widget.Valid()) {
    Am_Object window = widget.Get(Am_WINDOW);
    if (window.Valid())
      Am_Finish_Pop_Up_Waiting(window, Am_Value(false));
  }
  // else do nothing, something's not valid.
}